

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O2

void __thiscall rtc::LogMessage::~LogMessage(LogMessage *this)

{
  ostream *poVar1;
  string *tag;
  LoggingSeverity severity;
  undefined8 *puVar2;
  CritScope cs;
  CritScope local_50;
  string local_48;
  
  if ((this->extra_)._M_string_length != 0) {
    poVar1 = std::operator<<((ostream *)this," : ");
    std::operator<<(poVar1,(string *)&this->extra_);
  }
  std::endl<char,std::char_traits<char>>((ostream *)this);
  severity = (int)this + 8;
  std::__cxx11::stringbuf::str();
  if (dbg_sev_ <= (int)this->severity_) {
    OutputToDebug(&local_48,severity,tag);
  }
  CritScope::CritScope(&local_50,(CriticalSection *)(anonymous_namespace)::g_log_crit);
  puVar2 = &streams__abi_cxx11_;
  while (puVar2 = (undefined8 *)*puVar2, puVar2 != &streams__abi_cxx11_) {
    if (*(int *)(puVar2 + 3) <= (int)this->severity_) {
      (**(code **)(*(long *)puVar2[2] + 0x10))((long *)puVar2[2],&local_48);
    }
  }
  CritScope::~CritScope(&local_50);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&this->extra_);
  std::__cxx11::string::~string((string *)&this->tag_);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)this);
  return;
}

Assistant:

LogMessage::~LogMessage() {
  if (!extra_.empty())
    print_stream_ << " : " << extra_;
  print_stream_ << std::endl;

  const std::string& str = print_stream_.str();
  if (severity_ >= dbg_sev_) {
    OutputToDebug(str, severity_, tag_);
  }

  CritScope cs(&g_log_crit);
  for (auto& kv : streams_) {
    if (severity_ >= kv.second) {
      kv.first->OnLogMessage(str);
    }
  }
}